

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

void __thiscall
amrex::MLMG::checkPoint
          (MLMG *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_sol,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *a_rhs,
          Real a_tol_rel,Real a_tol_abs,char *a_file_name)

{
  FabArray<amrex::FArrayBox> *pFVar1;
  MLLinOp *pMVar2;
  ostream *poVar3;
  int __val;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  Real local_2d0;
  Real local_2c8;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *local_2c0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_2b8;
  string HeaderFileName;
  string file_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  ofstream HeaderFile;
  undefined8 auStack_228 [3];
  int aiStack_210 [120];
  
  local_2d0 = a_tol_abs;
  local_2c8 = a_tol_rel;
  local_2c0 = a_rhs;
  local_2b8 = a_sol;
  std::__cxx11::string::string((string *)&file_name,a_file_name,(allocator *)&HeaderFile);
  UtilCreateCleanDirectory(&file_name,false);
  if (*(int *)(DAT_006e0650 + -0x3c) == *(int *)(DAT_006e0650 + -0x30)) {
    std::__cxx11::string::string((string *)&HeaderFile,a_file_name,(allocator *)&local_2f0);
    std::operator+(&HeaderFileName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&HeaderFile,
                   "/Header");
    std::__cxx11::string::~string((string *)&HeaderFile);
    std::ofstream::ofstream(&HeaderFile);
    std::ofstream::open((char *)&HeaderFile,(_Ios_Openmode)HeaderFileName._M_dataplus._M_p);
    lVar4 = *(long *)(_HeaderFile + -0x18);
    if (*(int *)((long)aiStack_210 + lVar4) != 0) {
      FileOpenFailed(&HeaderFileName);
      lVar4 = *(long *)(_HeaderFile + -0x18);
    }
    *(undefined8 *)((long)auStack_228 + lVar4) = 0x11;
    (*this->linop->_vptr_MLLinOp[2])(&local_2f0);
    poVar3 = std::operator<<((ostream *)&HeaderFile,(string *)&local_2f0);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"a_tol_rel = ");
    poVar3 = std::ostream::_M_insert<double>(local_2c8);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"a_tol_abs = ");
    poVar3 = std::ostream::_M_insert<double>(local_2d0);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"verbose = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->verbose);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"max_iters = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->max_iters);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"nu1 = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->nu1);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"nu2 = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->nu2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"nuf = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->nuf);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"nub = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->nub);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"max_fmg_iters = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->max_fmg_iters);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"bottom_solver = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->bottom_solver);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"bottom_verbose = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->bottom_verbose);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"bottom_maxiter = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->bottom_maxiter);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"bottom_reltol = ");
    poVar3 = std::ostream::_M_insert<double>(this->bottom_reltol);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"always_use_bnorm = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->always_use_bnorm);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"namrlevs = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->namrlevs);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"finest_amr_lev = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->finest_amr_lev);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"linop_prepared = ");
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"solve_called = ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_2f0);
    for (__val = 0; __val <= this->finest_amr_lev; __val = __val + 1) {
      std::operator+(&local_270,&file_name,"/Level_");
      std::__cxx11::to_string(&local_250,__val);
      std::operator+(&local_2f0,&local_270,&local_250);
      UtilCreateCleanDirectory(&local_2f0,false);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
    }
    std::ofstream::~ofstream(&HeaderFile);
    std::__cxx11::string::~string((string *)&HeaderFileName);
  }
  for (lVar4 = 0; lVar4 <= this->finest_amr_lev; lVar4 = lVar4 + 1) {
    pFVar1 = &(local_2b8->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4]->super_FabArray<amrex::FArrayBox>;
    std::operator+(&local_2f0,&file_name,"/Level_");
    std::__cxx11::to_string(&local_270,(int)lVar4);
    std::operator+(&HeaderFileName,&local_2f0,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&HeaderFile,
                   &HeaderFileName,"/sol");
    VisMF::Write(pFVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &HeaderFile,NFiles,false);
    std::__cxx11::string::~string((string *)&HeaderFile);
    std::__cxx11::string::~string((string *)&HeaderFileName);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2f0);
    pFVar1 = &(local_2c0->
              super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
              super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar4]->super_FabArray<amrex::FArrayBox>;
    std::operator+(&local_2f0,&file_name,"/Level_");
    std::__cxx11::to_string(&local_270,(int)lVar4);
    std::operator+(&HeaderFileName,&local_2f0,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&HeaderFile,
                   &HeaderFileName,"/rhs");
    VisMF::Write(pFVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &HeaderFile,NFiles,false);
    std::__cxx11::string::~string((string *)&HeaderFile);
    std::__cxx11::string::~string((string *)&HeaderFileName);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2f0);
  }
  pMVar2 = this->linop;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&HeaderFile,
                 &file_name,"/linop");
  (*pMVar2->_vptr_MLLinOp[0x44])(pMVar2,&HeaderFile);
  std::__cxx11::string::~string((string *)&HeaderFile);
  std::__cxx11::string::~string((string *)&file_name);
  return;
}

Assistant:

void
MLMG::checkPoint (const Vector<MultiFab*>& a_sol, const Vector<MultiFab const*>& a_rhs,
                  Real a_tol_rel, Real a_tol_abs, const char* a_file_name) const
{
    std::string file_name(a_file_name);
    UtilCreateCleanDirectory(file_name, false);

    if (ParallelContext::IOProcessorSub())
    {
        std::string HeaderFileName(std::string(a_file_name)+"/Header");
        std::ofstream HeaderFile;
        HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                std::ofstream::trunc |
                                                std::ofstream::binary);
        if( ! HeaderFile.good()) {
            FileOpenFailed(HeaderFileName);
        }

        HeaderFile.precision(17);

        HeaderFile << linop.name() << "\n"
                   << "a_tol_rel = " << a_tol_rel << "\n"
                   << "a_tol_abs = " << a_tol_abs << "\n"
                   << "verbose = " << verbose << "\n"
                   << "max_iters = " << max_iters << "\n"
                   << "nu1 = " << nu1 << "\n"
                   << "nu2 = " << nu2 << "\n"
                   << "nuf = " << nuf << "\n"
                   << "nub = " << nub << "\n"
                   << "max_fmg_iters = " << max_fmg_iters << "\n"
                   << "bottom_solver = " << static_cast<int>(bottom_solver) << "\n"
                   << "bottom_verbose = " << bottom_verbose << "\n"
                   << "bottom_maxiter = " << bottom_maxiter << "\n"
                   << "bottom_reltol = " << bottom_reltol << "\n"
                   << "always_use_bnorm = " << always_use_bnorm << "\n"
                   << "namrlevs = " << namrlevs << "\n"
                   << "finest_amr_lev = " << finest_amr_lev << "\n"
                   << "linop_prepared = " << linop_prepared << "\n"
                   << "solve_called = " << solve_called << "\n";

        for (int ilev = 0; ilev <= finest_amr_lev; ++ilev) {
            UtilCreateCleanDirectory(file_name+"/Level_"+std::to_string(ilev), false);
        }
    }

    ParallelContext::BarrierSub();

    for (int ilev = 0; ilev <= finest_amr_lev; ++ilev) {
        VisMF::Write(*a_sol[ilev], file_name+"/Level_"+std::to_string(ilev)+"/sol");
        VisMF::Write(*a_rhs[ilev], file_name+"/Level_"+std::to_string(ilev)+"/rhs");
    }

    linop.checkPoint(file_name+"/linop");
}